

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::OneofDescriptor::DebugString
          (OneofDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options
          )

{
  ushort *puVar1;
  FeatureSet *from;
  long lVar2;
  InternalMetadata arena;
  size_t in_R9;
  long lVar3;
  string_view format;
  string_view format_00;
  string prefix;
  SourceLocationCommentPrinter comment_printer;
  OneofOptions full_options;
  Arena *local_150;
  _func_int **local_148;
  undefined1 local_140 [16];
  undefined1 local_130 [120];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  OneofOptions local_98;
  _func_int **local_48;
  Arena *local_40;
  
  local_150 = (Arena *)local_140;
  std::__cxx11::string::_M_construct((ulong)&local_150,(char)depth * '\x02');
  local_130._24_8_ = local_130 + 0x28;
  local_130._32_8_ = (__pointer_type)0x0;
  local_130[0x28] = '\0';
  local_130._56_8_ = local_130 + 0x48;
  local_130._64_8_ = (CleanupNode *)0x0;
  local_130[0x48] = '\0';
  local_130._88_8_ = (__pointer_type)0x0;
  local_130._96_8_ = 0;
  local_130._104_8_ = (__pointer_type)0x0;
  local_130[0x70] = debug_string_options->include_comments;
  local_130[0x71] = debug_string_options->elide_group_body;
  local_130[0x72] = debug_string_options->elide_oneof_body;
  local_b8._M_p = (pointer)&local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_150,(undefined1 *)((long)local_148 + (long)local_150));
  if (debug_string_options->include_comments == true) {
    local_130[0] = GetSourceLocation(this,(SourceLocation *)(local_130 + 8));
  }
  else {
    local_130[0] = false;
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_130,contents);
  puVar1 = (ushort *)(this->all_names_).payload_;
  local_98.field_0._impl_._extensions_.arena_ = (Arena *)(ulong)*puVar1;
  local_98.super_Message.super_MessageLite._vptr_MessageLite = local_148;
  local_98.super_Message.super_MessageLite._internal_metadata_.ptr_ = (intptr_t)local_150;
  local_98.field_0._8_8_ = (long)puVar1 + ~(ulong)local_98.field_0._impl_._extensions_.arena_;
  format._M_str = (char *)&local_98;
  format._M_len = (size_t)"$0oneof $1 {";
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)contents,(Nonnull<std::string_*>)0xc,format,
             (Nullable<const_absl::string_view_*>)0x2,in_R9);
  OneofOptions::OneofOptions(&local_98,(Arena *)0x0,this->options_);
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    local_98.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
         local_98.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
    if (local_98.field_0._impl_.features_ == (FeatureSet *)0x0) {
      arena.ptr_ = local_98.super_Message.super_MessageLite._internal_metadata_.ptr_;
      if ((local_98.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
        arena.ptr_ = *(undefined8 *)
                      (local_98.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                      0xfffffffffffffffe);
      }
      local_98.field_0._impl_.features_ =
           (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>((Arena *)arena.ptr_);
    }
    FeatureSet::CopyFrom(local_98.field_0._impl_.features_,from);
  }
  anon_unknown_24::FormatLineOptions
            (depth + 1,&local_98.super_Message,this->containing_type_->file_->pool_,contents);
  if (debug_string_options->elide_oneof_body == true) {
    std::__cxx11::string::append((char *)contents);
  }
  else {
    std::__cxx11::string::append((char *)contents);
    if (0 < this->field_count_) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        FieldDescriptor::DebugString
                  ((FieldDescriptor *)(&this->fields_->super_SymbolBase + lVar3),depth + 1,contents,
                   debug_string_options);
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x58;
      } while (lVar2 < this->field_count_);
    }
    local_48 = local_148;
    local_40 = local_150;
    format_00._M_str = (char *)&local_48;
    format_00._M_len = (size_t)"$0}\n";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)contents,(Nonnull<std::string_*>)0x4,format_00,
               (Nullable<const_absl::string_view_*>)0x1,in_R9);
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_130,contents);
  OneofOptions::~OneofOptions(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_130 + 0x58));
  if ((Chunk *)local_130._56_8_ != (Chunk *)(local_130 + 0x48)) {
    operator_delete((void *)local_130._56_8_,CONCAT71(local_130._73_7_,local_130[0x48]) + 1);
  }
  if ((undefined1 *)local_130._24_8_ != local_130 + 0x28) {
    operator_delete((void *)local_130._24_8_,CONCAT71(local_130._41_7_,local_130[0x28]) + 1);
  }
  if (local_150 != (Arena *)local_140) {
    operator_delete(local_150,local_140._0_8_ + 1);
  }
  return;
}

Assistant:

void OneofDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;
  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);
  absl::SubstituteAndAppend(contents, "$0oneof $1 {", prefix, name());

  OneofOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  FormatLineOptions(depth, full_options, containing_type()->file()->pool(),
                    contents);

  if (debug_string_options.elide_oneof_body) {
    contents->append(" ... }\n");
  } else {
    contents->append("\n");
    for (int i = 0; i < field_count(); i++) {
      field(i)->DebugString(depth, contents, debug_string_options);
    }
    absl::SubstituteAndAppend(contents, "$0}\n", prefix);
  }
  comment_printer.AddPostComment(contents);
}